

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::RegisterCommand::~RegisterCommand(RegisterCommand *this)

{
  (this->super_CommandMixin<(wabt::CommandType)2>).super_Command._vptr_Command =
       (_func_int **)&PTR__RegisterCommand_001dbee8;
  Var::~Var(&this->var);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

RegisterCommand(string_view module_name, const Var& var)
      : module_name(module_name), var(var) {}